

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler,bool isKey)

{
  byte *pbVar1;
  ushort uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  Stack<rapidjson::CrtAllocator> *pSVar20;
  SizeType length;
  Ch *pCVar21;
  bool bVar22;
  uint uVar23;
  uint uVar24;
  byte *pbVar25;
  char *pcVar26;
  ulong uVar27;
  byte bVar28;
  ulong count;
  size_t escapeOffset;
  byte *pbVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  StackStream<char> local_78;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> copy;
  
  copy.s.src_ = (*is).src_;
  local_78.length_ = 0;
  copy.s.src_ = copy.s.src_ + 1;
  copy.s.head_ = (*is).head_;
  pbVar29 = (byte *)copy.s.src_;
  local_78.stack_ = (Stack<rapidjson::CrtAllocator> *)this;
  copy.original_ = is;
  do {
    pbVar1 = pbVar29 + 0xf;
    for (; pSVar20 = local_78.stack_, pbVar29 != (byte *)((ulong)pbVar1 & 0xfffffffffffffff0);
        pbVar29 = pbVar29 + 1) {
      bVar28 = *pbVar29;
      if (((bVar28 == 0x22) || (bVar28 == 0x5c)) || (bVar28 < 0x20)) goto LAB_0014baa9;
      pbVar25 = (byte *)(local_78.stack_)->stackTop_;
      if ((byte *)(local_78.stack_)->stackEnd_ == pbVar25 ||
          (long)(local_78.stack_)->stackEnd_ - (long)pbVar25 < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,1);
        pbVar25 = (byte *)pSVar20->stackTop_;
      }
      pSVar20->stackTop_ = (char *)(pbVar25 + 1);
      *pbVar25 = bVar28;
      local_78.length_ = local_78.length_ + 1;
    }
    while( true ) {
      pSVar20 = local_78.stack_;
      bVar28 = *pbVar29;
      bVar3 = pbVar29[1];
      bVar4 = pbVar29[2];
      bVar5 = pbVar29[3];
      bVar6 = pbVar29[4];
      bVar7 = pbVar29[5];
      bVar8 = pbVar29[6];
      bVar9 = pbVar29[7];
      uVar18 = *(undefined8 *)pbVar29;
      bVar10 = pbVar29[8];
      bVar11 = pbVar29[9];
      bVar12 = pbVar29[10];
      bVar13 = pbVar29[0xb];
      bVar14 = pbVar29[0xc];
      bVar15 = pbVar29[0xd];
      bVar16 = pbVar29[0xe];
      bVar17 = pbVar29[0xf];
      uVar19 = *(undefined8 *)(pbVar29 + 8);
      auVar30[0] = -(bVar28 == 0x22);
      auVar30[1] = -(bVar3 == 0x22);
      auVar30[2] = -(bVar4 == 0x22);
      auVar30[3] = -(bVar5 == 0x22);
      auVar30[4] = -(bVar6 == 0x22);
      auVar30[5] = -(bVar7 == 0x22);
      auVar30[6] = -(bVar8 == 0x22);
      auVar30[7] = -(bVar9 == 0x22);
      auVar30[8] = -(bVar10 == 0x22);
      auVar30[9] = -(bVar11 == 0x22);
      auVar30[10] = -(bVar12 == 0x22);
      auVar30[0xb] = -(bVar13 == 0x22);
      auVar30[0xc] = -(bVar14 == 0x22);
      auVar30[0xd] = -(bVar15 == 0x22);
      auVar30[0xe] = -(bVar16 == 0x22);
      auVar30[0xf] = -(bVar17 == 0x22);
      auVar32[0] = -(bVar28 == 0x5c);
      auVar32[1] = -(bVar3 == 0x5c);
      auVar32[2] = -(bVar4 == 0x5c);
      auVar32[3] = -(bVar5 == 0x5c);
      auVar32[4] = -(bVar6 == 0x5c);
      auVar32[5] = -(bVar7 == 0x5c);
      auVar32[6] = -(bVar8 == 0x5c);
      auVar32[7] = -(bVar9 == 0x5c);
      auVar32[8] = -(bVar10 == 0x5c);
      auVar32[9] = -(bVar11 == 0x5c);
      auVar32[10] = -(bVar12 == 0x5c);
      auVar32[0xb] = -(bVar13 == 0x5c);
      auVar32[0xc] = -(bVar14 == 0x5c);
      auVar32[0xd] = -(bVar15 == 0x5c);
      auVar32[0xe] = -(bVar16 == 0x5c);
      auVar32[0xf] = -(bVar17 == 0x5c);
      auVar31[0] = -((byte)((0x1f < bVar28) * '\x1f' | (0x1f >= bVar28) * bVar28) == bVar28);
      auVar31[1] = -((byte)((0x1f < bVar3) * '\x1f' | (0x1f >= bVar3) * bVar3) == bVar3);
      auVar31[2] = -((byte)((0x1f < bVar4) * '\x1f' | (0x1f >= bVar4) * bVar4) == bVar4);
      auVar31[3] = -((byte)((0x1f < bVar5) * '\x1f' | (0x1f >= bVar5) * bVar5) == bVar5);
      auVar31[4] = -((byte)((0x1f < bVar6) * '\x1f' | (0x1f >= bVar6) * bVar6) == bVar6);
      auVar31[5] = -((byte)((0x1f < bVar7) * '\x1f' | (0x1f >= bVar7) * bVar7) == bVar7);
      auVar31[6] = -((byte)((0x1f < bVar8) * '\x1f' | (0x1f >= bVar8) * bVar8) == bVar8);
      auVar31[7] = -((byte)((0x1f < bVar9) * '\x1f' | (0x1f >= bVar9) * bVar9) == bVar9);
      auVar31[8] = -((byte)((0x1f < bVar10) * '\x1f' | (0x1f >= bVar10) * bVar10) == bVar10);
      auVar31[9] = -((byte)((0x1f < bVar11) * '\x1f' | (0x1f >= bVar11) * bVar11) == bVar11);
      auVar31[10] = -((byte)((0x1f < bVar12) * '\x1f' | (0x1f >= bVar12) * bVar12) == bVar12);
      auVar31[0xb] = -((byte)((0x1f < bVar13) * '\x1f' | (0x1f >= bVar13) * bVar13) == bVar13);
      auVar31[0xc] = -((byte)((0x1f < bVar14) * '\x1f' | (0x1f >= bVar14) * bVar14) == bVar14);
      auVar31[0xd] = -((byte)((0x1f < bVar15) * '\x1f' | (0x1f >= bVar15) * bVar15) == bVar15);
      auVar31[0xe] = -((byte)((0x1f < bVar16) * '\x1f' | (0x1f >= bVar16) * bVar16) == bVar16);
      auVar31[0xf] = -((byte)((0x1f < bVar17) * '\x1f' | (0x1f >= bVar17) * bVar17) == bVar17);
      auVar31 = auVar31 | auVar32 | auVar30;
      uVar2 = (ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar31[0xf] >> 7) << 0xf;
      if (uVar2 != 0) break;
      local_78.length_ = local_78.length_ + 0x10;
      pcVar26 = (local_78.stack_)->stackTop_;
      if ((long)(local_78.stack_)->stackEnd_ - (long)pcVar26 < 0x10) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,0x10);
        pcVar26 = pSVar20->stackTop_;
      }
      pSVar20->stackTop_ = pcVar26 + 0x10;
      *(undefined8 *)pcVar26 = uVar18;
      *(undefined8 *)(pcVar26 + 8) = uVar19;
      pbVar29 = pbVar29 + 0x10;
    }
    uVar23 = 0;
    if (uVar2 != 0) {
      for (; (uVar2 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
      }
    }
    if (uVar23 != 0) {
      count = (ulong)(uVar23 & 0xffff);
      local_78.length_ = local_78.length_ + (uVar23 & 0xffff);
      pcVar26 = (local_78.stack_)->stackTop_;
      if ((long)(local_78.stack_)->stackEnd_ - (long)pcVar26 < (long)count) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,count);
        pcVar26 = pSVar20->stackTop_;
      }
      pSVar20->stackTop_ = pcVar26 + count;
      for (uVar27 = 0; count != uVar27; uVar27 = uVar27 + 1) {
        pcVar26[uVar27] = pbVar29[uVar27];
      }
      pbVar29 = pbVar29 + count;
    }
LAB_0014baa9:
    pSVar20 = local_78.stack_;
    copy.s.src_ = (Ch *)pbVar29;
    bVar28 = *pbVar29;
    if (bVar28 == 0x5c) {
      escapeOffset = (long)pbVar29 - (long)copy.s.head_;
      copy.s.src_ = (Ch *)(pbVar29 + 1);
      bVar28 = ParseStringToStream<160u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>(rapidjson::GenericStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>&)
               ::escape[pbVar29[1]];
      if (bVar28 != 0) {
        copy.s.src_ = (Ch *)(pbVar29 + 2);
        pbVar29 = (byte *)(local_78.stack_)->stackTop_;
        if ((byte *)(local_78.stack_)->stackEnd_ == pbVar29 ||
            (long)(local_78.stack_)->stackEnd_ - (long)pbVar29 < 0) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,1);
          goto LAB_0014bb5b;
        }
        goto LAB_0014bae9;
      }
      if (pbVar29[1] != 0x75) {
        *(undefined4 *)(this + 0x30) = 10;
LAB_0014bd14:
        *(size_t *)(this + 0x38) = escapeOffset;
        goto LAB_0014bcca;
      }
      copy.s.src_ = (Ch *)(pbVar29 + 2);
      uVar23 = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                         ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)this,&copy.s,escapeOffset);
      if (*(int *)(this + 0x30) != 0) goto LAB_0014bcca;
      if ((uVar23 & 0xfffffc00) == 0xd800) {
        pCVar21 = copy.s.src_;
        if ((*copy.s.src_ == '\\') && (copy.s.src_ = copy.s.src_ + 1, pCVar21[1] == 'u')) {
          copy.s.src_ = pCVar21 + 2;
          uVar24 = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                             ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                               *)this,&copy.s,escapeOffset);
          if (*(int *)(this + 0x30) != 0) goto LAB_0014bcca;
          if (0xfffffbff < uVar24 - 0xe000) {
            uVar23 = uVar23 * 0x400 + uVar24 + 0xfca02400;
            goto LAB_0014bbb5;
          }
        }
        *(undefined4 *)(this + 0x30) = 9;
        goto LAB_0014bd14;
      }
LAB_0014bbb5:
      UTF8<char>::
      Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                (&local_78,uVar23);
    }
    else {
      if (bVar28 == 0x22) {
        copy.s.src_ = (Ch *)(pbVar29 + 1);
        pcVar26 = (local_78.stack_)->stackTop_;
        if ((local_78.stack_)->stackEnd_ == pcVar26 ||
            (long)(local_78.stack_)->stackEnd_ - (long)pcVar26 < 0) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,1);
          pcVar26 = pSVar20->stackTop_;
        }
        length = local_78.length_;
        pSVar20->stackTop_ = pcVar26 + 1;
        *pcVar26 = '\0';
        local_78.length_ = local_78.length_ + 1;
        if (*(int *)(this + 0x30) == 0) {
          pcVar26 = (local_78.stack_)->stackTop_;
          (local_78.stack_)->stackTop_ = pcVar26 + -(ulong)local_78.length_;
          bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::String(handler,pcVar26 + -(ulong)local_78.length_,length,true);
          if (!bVar22) {
            *(undefined4 *)(this + 0x30) = 0x10;
            *(long *)(this + 0x38) = (long)copy.s.src_ - (long)copy.s.head_;
          }
        }
        goto LAB_0014bcca;
      }
      if (bVar28 < 0x20) {
        if (bVar28 == 0) {
          *(undefined4 *)(this + 0x30) = 0xb;
        }
        else {
          *(undefined4 *)(this + 0x30) = 0xc;
        }
        *(long *)(this + 0x38) = (long)pbVar29 - (long)copy.s.head_;
LAB_0014bcca:
        (copy.original_)->src_ = copy.s.src_;
        (copy.original_)->head_ = copy.s.head_;
        return;
      }
      copy.s.src_ = (Ch *)(pbVar29 + 1);
      bVar28 = *pbVar29;
      pbVar29 = (byte *)(local_78.stack_)->stackTop_;
      if ((byte *)(local_78.stack_)->stackEnd_ == pbVar29 ||
          (long)(local_78.stack_)->stackEnd_ - (long)pbVar29 < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_78.stack_,1);
LAB_0014bb5b:
        pbVar29 = (byte *)pSVar20->stackTop_;
      }
LAB_0014bae9:
      pSVar20->stackTop_ = (char *)(pbVar29 + 1);
      *pbVar29 = bVar28;
      local_78.length_ = local_78.length_ + 1;
    }
    pbVar29 = (byte *)copy.s.src_;
  } while( true );
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false) {
        internal::StreamLocalCopy<InputStream> copy(is);
        InputStream& s(copy.s);

        RAPIDJSON_ASSERT(s.Peek() == '\"');
        s.Take();  // Skip '\"'

        bool success = false;
        if (parseFlags & kParseInsituFlag) {
            typename InputStream::Ch *head = s.PutBegin();
            ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            size_t length = s.PutEnd(head) - 1;
            RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
            const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
            success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
        }
        else {
            StackStream<typename TargetEncoding::Ch> stackStream(stack_);
            ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
            const typename TargetEncoding::Ch* const str = stackStream.Pop();
            success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
        }
        if (RAPIDJSON_UNLIKELY(!success))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }